

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t aead_encrypt(st_ptls_traffic_protection_t *ctx,void *output,void *input,size_t inlen,
                   uint8_t content_type)

{
  uint64_t seq;
  uint8_t local_5d [5];
  undefined1 auStack_58 [3];
  uint8_t aad [5];
  ptls_iovec_t invec [2];
  uint8_t local_29;
  size_t sStack_28;
  uint8_t content_type_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  st_ptls_traffic_protection_t *ctx_local;
  
  local_29 = content_type;
  sStack_28 = inlen;
  inlen_local = (size_t)input;
  input_local = output;
  output_local = ctx;
  _auStack_58 = ptls_iovec_init(input,inlen);
  ptls_iovec_init(&local_29,1);
  build_aad(local_5d,sStack_28 + 1 + *(long *)(**(long **)((long)output_local + 0x48) + 0x38));
  seq = *(uint64_t *)((long)output_local + 0x50);
  *(uint64_t *)((long)output_local + 0x50) = seq + 1;
  ptls_aead_encrypt_v(*(ptls_aead_context_t **)((long)output_local + 0x48),input_local,
                      (ptls_iovec_t *)auStack_58,2,seq,local_5d,5);
  return sStack_28 + 1 + *(long *)(**(long **)((long)output_local + 0x48) + 0x38);
}

Assistant:

static size_t aead_encrypt(struct st_ptls_traffic_protection_t *ctx, void *output, const void *input, size_t inlen,
                           uint8_t content_type)
{
    ptls_iovec_t invec[2] = {ptls_iovec_init(input, inlen), ptls_iovec_init(&content_type, 1)};
    uint8_t aad[5];

    build_aad(aad, inlen + 1 + ctx->aead->algo->tag_size);
    ptls_aead_encrypt_v(ctx->aead, output, invec, PTLS_ELEMENTSOF(invec), ctx->seq++, aad, sizeof(aad));

    return inlen + 1 + ctx->aead->algo->tag_size;
}